

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
::erase(btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
        *this,iterator iter)

{
  size_type *psVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  field_type fVar6;
  byte bVar7;
  uint *puVar8;
  uint *puVar9;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar10;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar11;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar12;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
  _Var13;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *this_00;
  ulong in_RCX;
  allocator_type *paVar14;
  allocator_type *extraout_RDX;
  allocator_type *extraout_RDX_00;
  uint uVar15;
  int iVar16;
  iterator iVar17;
  iterator iVar18;
  uint local_64;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_50;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_40;
  
  pbVar12 = iter.node;
  uVar15 = iter.position;
  local_50.node = pbVar12;
  local_50.position = uVar15;
  bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::leaf(pbVar12);
  paVar14 = extraout_RDX;
  if (!bVar3) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
    ::operator--(&local_50);
    bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::leaf(local_50.node);
    if (!bVar4) {
      __assert_fail("iter.node->leaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xa7e,
                    "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::erase(iterator) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                   );
    }
    puVar8 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                     ::slot(local_50.node,(long)local_50.position);
    puVar9 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                     ::slot(pbVar12,(long)(int)uVar15);
    in_RCX = (ulong)*puVar8;
    *puVar9 = *puVar8;
    paVar14 = extraout_RDX_00;
    pbVar12 = local_50.node;
    uVar15 = local_50.position;
  }
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  ::remove_value(pbVar12,uVar15,paVar14);
  psVar1 = &(this->tree_).size_;
  *psVar1 = *psVar1 - 1;
  bVar4 = true;
  local_64 = local_50.position;
  pbVar12 = local_50.node;
  this_00 = local_50.node;
  uVar15 = local_50.position;
  do {
    _Var13._M_head_impl =
         (this->tree_).root_.
         super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
         ._M_head_impl;
    local_40.node = this_00;
    if (pbVar12 == _Var13._M_head_impl) {
      fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::count(_Var13._M_head_impl);
      if (fVar6 == '\0') {
        bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::leaf((this->tree_).root_.
                       super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                       ._M_head_impl);
        if (bVar4) {
          if ((this->tree_).size_ != 0) {
            __assert_fail("size() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xbfc,
                          "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_shrink() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                         );
          }
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::delete_leaf_node(&this->tree_,
                             (this->tree_).root_.
                             super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                             ._M_head_impl);
          (this->tree_).root_.
          super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
          ._M_head_impl =
               (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                *)btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
                  ::EmptyNode()::empty_node;
          (this->tree_).rightmost_ =
               (node_type *)
               btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
               ::EmptyNode()::empty_node;
        }
        else {
          _Var13._M_head_impl =
               btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               ::child((this->tree_).root_.
                       super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                       .
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                       ._M_head_impl,0);
          pbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::parent(_Var13._M_head_impl);
          bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  ::is_root(pbVar12);
          if (!bVar4) {
            __assert_fail("parent()->is_root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x4ad,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::make_root() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                         );
          }
          pbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::parent(_Var13._M_head_impl);
          pbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::parent(pbVar12);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::set_parent(_Var13._M_head_impl,pbVar12);
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::delete_internal_node
                    (&this->tree_,
                     (this->tree_).root_.
                     super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                     ._M_head_impl);
          (this->tree_).root_.
          super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
          .
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
          ._M_head_impl = _Var13._M_head_impl;
        }
      }
      if ((this->tree_).size_ == 0) {
        iVar17 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                 ::end(&this->tree_);
        this_00 = iVar17.node;
        local_64 = iVar17.position;
      }
      else {
LAB_001c224c:
        bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::count(this_00);
        if (local_64 == bVar5) {
          bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  ::count(this_00);
          local_40.position = bVar5 - 1;
          btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
          ::operator++(&local_40);
          this_00 = local_40.node;
          local_64 = local_40.position;
        }
      }
      local_40.node = this_00;
      if (!bVar3) {
        local_40.position = local_64;
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
        ::operator++(&local_40);
        local_64 = local_40.position;
      }
      iVar18.position = local_64;
      iVar18.node = local_40.node;
      iVar18._12_4_ = 0;
      return iVar18;
    }
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::count(pbVar12);
    if (0x1d < bVar5) goto LAB_001c224c;
    pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::parent(pbVar12);
    fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::position(pbVar12);
    if (fVar6 == '\0') {
LAB_001c1f80:
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::position(pbVar12);
      bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::count(pbVar10);
      if (bVar7 <= bVar5) goto LAB_001c2128;
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::position(pbVar12);
      pbVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::child(pbVar10,(ulong)bVar5 + 1);
      fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::max_count(pbVar11);
      if (fVar6 != '=') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xbd0,
                      "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                     );
      }
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::count(pbVar12);
      bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::count(pbVar11);
      if ((uint)bVar7 + (uint)bVar5 + 1 < 0x3e) {
        btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
        ::merge_nodes(&this->tree_,pbVar12,pbVar11);
        pbVar11 = pbVar12;
        goto LAB_001c201d;
      }
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::count(pbVar11);
      if (bVar5 < 0x1f) {
LAB_001c2128:
        fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::position(pbVar12);
        if (fVar6 != '\0') {
          bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  ::position(pbVar12);
          pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar10,(ulong)bVar5 - 1);
          bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  ::count(pbVar10);
          if ((0x1e < bVar5) &&
             ((fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                       ::count(pbVar12), fVar6 == '\0' ||
              (bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                       ::count(pbVar12), (int)uVar15 < (int)(uint)bVar5)))) {
            bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar10);
            bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar12);
            paVar14 = (allocator_type *)CONCAT62((int6)(in_RCX >> 0x10),2);
            iVar16 = (int)((short)((ushort)bVar5 - (ushort)bVar7) / 2);
            bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar10);
            iVar2 = bVar5 - 1;
            if (iVar16 <= (int)(bVar5 - 1)) {
              iVar2 = iVar16;
            }
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::rebalance_left_to_right(pbVar10,iVar2,pbVar12,paVar14);
            uVar15 = iVar2 + uVar15;
          }
        }
      }
      else {
        fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::count(pbVar12);
        in_RCX = in_RCX & 0xffffffffffffff00;
        if ((int)uVar15 < 1 && fVar6 != '\0') goto LAB_001c2128;
        bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::count(pbVar11);
        bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::count(pbVar12);
        paVar14 = (allocator_type *)CONCAT62((int6)(in_RCX >> 0x10),2);
        iVar16 = (int)((short)((ushort)bVar5 - (ushort)bVar7) / 2);
        bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::count(pbVar11);
        iVar2 = bVar5 - 1;
        if (iVar16 <= (int)(bVar5 - 1)) {
          iVar2 = iVar16;
        }
        btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
        ::rebalance_right_to_left(pbVar12,iVar2,pbVar11,paVar14);
      }
      if (bVar4) {
        this_00 = pbVar12;
        local_64 = uVar15;
        local_40.node = pbVar12;
      }
      goto LAB_001c224c;
    }
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::position(pbVar12);
    pbVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::child(pbVar10,(ulong)bVar5 - 1);
    fVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::max_count(pbVar11);
    if (fVar6 != '=') {
      __assert_fail("left->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xbc5,
                    "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                   );
    }
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::count(pbVar11);
    bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::count(pbVar12);
    if (0x3d < (uint)bVar7 + (uint)bVar5 + 1) goto LAB_001c1f80;
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::count(pbVar11);
    uVar15 = uVar15 + bVar5 + 1;
    btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
    ::merge_nodes(&this->tree_,pbVar11,pbVar12);
LAB_001c201d:
    if (bVar4) {
      this_00 = pbVar11;
      local_64 = uVar15;
    }
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::position(pbVar11);
    uVar15 = (uint)bVar5;
    pbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::parent(pbVar11);
    bVar4 = false;
  } while( true );
}

Assistant:

iterator erase(iterator iter)       { return tree_.erase(iter); }